

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17898ce::
BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
::Common(BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
         *this,int block_size)

{
  ACMRandom *this_00;
  uint32_t uVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint uVar4;
  SEARCH_METHODS *message;
  int iVar5;
  int iVar6;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  this->w_ = (uint)::block_size_wide[block_size];
  this->h_ = (uint)::block_size_high[block_size];
  this_00 = &(this->
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>
             ).rng_;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,0x21);
  this->dst_offset_ = uVar1;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
  this->dst_stride_ = uVar1 + this->w_;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,0x21);
  this->src0_offset_ = uVar1;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
  this->src0_stride_ = uVar1 + this->w_;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,0x21);
  this->src1_offset_ = uVar1;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
  this->src1_stride_ = uVar1 + this->w_;
  uVar1 = testing::internal::Random::Generate(&this_00->random_,3);
  if (uVar1 == 2) {
    puVar3 = this->src0_;
    puVar2 = this->dst_tst_;
    this->src1_stride_ = this->dst_stride_;
    this->src1_offset_ = this->dst_offset_;
  }
  else {
    if (uVar1 == 1) {
      puVar3 = this->dst_tst_;
      this->src0_stride_ = this->dst_stride_;
      this->src0_offset_ = this->dst_offset_;
    }
    else {
      if (uVar1 != 0) {
        testing::Message::Message((Message *)&gtest_ar);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_1d_test.cc"
                   ,0x51,"Failed");
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == (long *)0x0) {
          return;
        }
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
        return;
      }
      puVar3 = this->src0_;
    }
    puVar2 = this->src1_;
  }
  (*(this->
    super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>
    ).
    super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>_>
    .super_Test._vptr_Test[6])(this,puVar3,puVar2);
  iVar6 = 0;
  do {
    if (this->h_ <= iVar6) {
      return;
    }
    for (iVar5 = 0; iVar5 < this->w_; iVar5 = iVar5 + 1) {
      uVar4 = this->dst_stride_ * iVar6 + this->dst_offset_ + iVar5;
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)&gtest_ar,"dst_ref_[dst_offset_ + r * dst_stride_ + c]",
                 "dst_tst_[dst_offset_ + r * dst_stride_ + c]",this->dst_ref_ + uVar4,
                 this->dst_tst_ + uVar4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_1d_test.cc"
                   ,0x59,(char *)message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_50.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        return;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void Common(int block_size) {
    w_ = block_size_wide[block_size];
    h_ = block_size_high[block_size];

    dst_offset_ = this->rng_(33);
    dst_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src0_offset_ = this->rng_(33);
    src0_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    src1_offset_ = this->rng_(33);
    src1_stride_ = this->rng_(kMaxWidth + 1 - w_) + w_;

    T *p_src0;
    T *p_src1;

    switch (this->rng_(3)) {
      case 0:  // Separate sources
        p_src0 = src0_;
        p_src1 = src1_;
        break;
      case 1:  // src0 == dst
        p_src0 = dst_tst_;
        src0_stride_ = dst_stride_;
        src0_offset_ = dst_offset_;
        p_src1 = src1_;
        break;
      case 2:  // src1 == dst
        p_src0 = src0_;
        p_src1 = dst_tst_;
        src1_stride_ = dst_stride_;
        src1_offset_ = dst_offset_;
        break;
      default: FAIL();
    }

    Execute(p_src0, p_src1);

    for (int r = 0; r < h_; ++r) {
      for (int c = 0; c < w_; ++c) {
        ASSERT_EQ(dst_ref_[dst_offset_ + r * dst_stride_ + c],
                  dst_tst_[dst_offset_ + r * dst_stride_ + c]);
      }
    }
  }